

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O0

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_remIleavedBits_naive_manual_::
~Test_bitileave_remIleavedBits_naive_manual_(Test_bitileave_remIleavedBits_naive_manual_ *this)

{
  Test_bitileave_remIleavedBits_naive_manual_ *this_local;
  
  ~Test_bitileave_remIleavedBits_naive_manual_(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

BITMANIP_TEST(bitileave, remIleavedBits_naive_manual)
{
    BITMANIP_STATIC_ASSERT_EQ(detail::remIleavedBits_naive(0xff, 0), 0xffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::remIleavedBits_naive(0xff, 1), 0xfu);
    BITMANIP_STATIC_ASSERT_EQ(detail::remIleavedBits_naive(0b01010101, 1), 0b1111u);
    BITMANIP_STATIC_ASSERT_EQ(detail::remIleavedBits_naive(0x5555'5555'5555'5555, 1), 0xffff'ffffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::remIleavedBits_naive(0x1111'1111'1111'1111, 3), 0b1111'1111'1111'1111u);

    BITMANIP_STATIC_ASSERT_EQ(detail::remIleavedBits_naive(0x5555'5555'5555'5555, 0), 0x5555'5555'5555'5555u);
    BITMANIP_STATIC_ASSERT_EQ(detail::remIleavedBits_naive(0x5, 1), 3u);
    BITMANIP_STATIC_ASSERT_EQ(detail::remIleavedBits_naive(0x5555'5555'5555'5555, 1), 0xffff'ffffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::remIleavedBits_naive(0xffff'ffff'ffff'ffff, 1), 0xffff'ffffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::remIleavedBits_naive(0xffff'ffff'ffff'ffff, 1), 0xffff'ffffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::remIleavedBits_naive(0x9249'2492'4924'9249, 2), 0x3fffffu);
}